

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
::PreprocessConstraint
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
           *this,int i,PreprocessInfoStd *preinfo)

{
  Type t;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  LinearFunctionalConstraint *in_RDX;
  undefined4 in_ESI;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
  *in_RDI;
  PreprocessInfo<int> *this_01;
  PreprocessInfo<mp::LinearFunctionalConstraint> prepro;
  PreprocessInfo<mp::LinearFunctionalConstraint> *in_stack_ffffffffffffffe0;
  LinearFunctionalConstraint *this_02;
  undefined4 in_stack_fffffffffffffff0;
  
  PreprocessInfo<mp::LinearFunctionalConstraint>::PreprocessInfo
            ((PreprocessInfo<mp::LinearFunctionalConstraint> *)&stack0xffffffffffffffd0);
  this_00 = GetConverter(in_RDI);
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>::Container>_>
  ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>::Container>_>
                *)this_00,(size_type)in_RDI);
  Container::GetCon((Container *)0x1e3e10);
  ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::PreprocessConstraint<mp::PreprocessInfo<mp::LinearFunctionalConstraint>>
            ((ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_stack_ffffffffffffffe0);
  this_02 = in_RDX;
  this_01 = (PreprocessInfo<int> *)
            PreprocessInfo<mp::LinearFunctionalConstraint>::lb
                      ((PreprocessInfo<mp::LinearFunctionalConstraint> *)&stack0xffffffffffffffd0);
  PreprocessInfo<mp::LinearFunctionalConstraint>::ub
            ((PreprocessInfo<mp::LinearFunctionalConstraint> *)&stack0xffffffffffffffd0);
  PreprocessInfo<int>::narrow_result_bounds(this_01,(double)in_RDX,(double)this_00);
  t = PreprocessInfo<mp::LinearFunctionalConstraint>::get_result_type
                ((PreprocessInfo<mp::LinearFunctionalConstraint> *)&stack0xffffffffffffffd0);
  PreprocessInfo<int>::set_result_type((PreprocessInfo<int> *)this_02,t);
  return;
}

Assistant:

void PreprocessConstraint(int i, PreprocessInfoStd& preinfo) override {
    if constexpr (std::is_base_of_v<FunctionalConstraint, Constraint>) {
      PreprocessInfo<Constraint> prepro;
      GetConverter().PreprocessConstraint(cons_[i].GetCon(), prepro);
      preinfo.narrow_result_bounds(prepro.lb(), prepro.ub());
      preinfo.set_result_type(prepro.get_result_type());
    }
  }